

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> * __thiscall
pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator=
          (optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *this,
          SampledGrid<pbrt::RGBUnboundedSpectrum> *v)

{
  reset(this);
  pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>::SampledGrid
            ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)this,v);
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(T &&v) {
        reset();
        new (ptr()) T(std::move(v));
        set = true;
        return *this;
    }